

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

int testingMul(void)

{
  ostream *this;
  allocator local_81;
  string local_80 [32];
  int local_60;
  int local_5c;
  int res;
  int i;
  size_t max2;
  size_t max1;
  pair<unsigned_long,_unsigned_long> sizes;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> *local_18;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> *__range1;
  
  ___begin1 = anon_unknown.dwarf_251e::defaultSizes();
  local_18 = (initializer_list<std::pair<unsigned_long,_unsigned_long>_> *)&__begin1;
  __end1 = std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::begin(local_18);
  sizes.second = (unsigned_long)
                 std::initializer_list<std::pair<unsigned_long,_unsigned_long>_>::end(local_18);
  do {
    if (__end1 == (const_iterator)sizes.second) {
      this = std::operator<<((ostream *)&std::cout,"Multiple test: OK");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    max2 = __end1->first;
    _res = __end1->second;
    max1 = max2;
    sizes.first = _res;
    for (local_5c = 0; local_5c < 100000; local_5c = local_5c + 1) {
      local_60 = anon_unknown.dwarf_251e::testingMul_ij((int)max2,(int)_res);
      if (local_60 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"Multiplication",&local_81);
        anon_unknown.dwarf_251e::printTestError
                  ((string *)local_80,max2,_res,(long)local_5c,(long)local_60);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        return local_60;
      }
      local_60 = 0;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

int testingMul() {
    for (auto sizes : defaultSizes()) {
        size_t max1 = sizes.first;
        size_t max2 = sizes.second;
        for(int i = 0; i < 100000; i++) {
            if (int res=testingMul_ij(max1, max2)) {
                printTestError("Multiplication", max1, max2, i, res);
                return res;
            }
        }
    }
    cout << "Multiple test: OK" << endl;
    return 0;
}